

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerBase.h
# Opt level: O3

void __thiscall RayTracerBase::RayTracerBase(RayTracerBase *this,RayTracerConfig *config)

{
  undefined1 uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  allocator_type local_29;
  
  uVar1 = (config->super_BaseConfig).field_0x33;
  (this->config).super_BaseConfig.background = (config->super_BaseConfig).background;
  (this->config).super_BaseConfig.field_0x33 = uVar1;
  iVar8 = (config->super_BaseConfig).antiAliasing;
  iVar9 = (config->super_BaseConfig).maxRecursionLevel;
  fVar10 = (config->super_BaseConfig).ambientCoefficient;
  iVar11 = (config->super_BaseConfig).imageX;
  iVar4 = (config->super_BaseConfig).imageY;
  iVar5 = (config->super_BaseConfig).imageZ;
  fVar6 = (config->super_BaseConfig).observer.x;
  fVar7 = (config->super_BaseConfig).observer.y;
  fVar2 = (config->super_BaseConfig).light.y;
  fVar3 = (config->super_BaseConfig).light.z;
  *(undefined8 *)&(this->config).super_BaseConfig.observer.z =
       *(undefined8 *)&(config->super_BaseConfig).observer.z;
  (this->config).super_BaseConfig.light.y = fVar2;
  (this->config).super_BaseConfig.light.z = fVar3;
  (this->config).super_BaseConfig.imageY = iVar4;
  (this->config).super_BaseConfig.imageZ = iVar5;
  (this->config).super_BaseConfig.observer.x = fVar6;
  (this->config).super_BaseConfig.observer.y = fVar7;
  (this->config).super_BaseConfig.antiAliasing = iVar8;
  (this->config).super_BaseConfig.maxRecursionLevel = iVar9;
  (this->config).super_BaseConfig.ambientCoefficient = fVar10;
  (this->config).super_BaseConfig.imageX = iVar11;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector(&(this->config).spheres,&config->spheres);
  std::vector<Plane,_std::allocator<Plane>_>::vector(&(this->config).planes,&config->planes);
  std::vector<Triangle,_std::allocator<Triangle>_>::vector
            (&(this->config).triangles,&config->triangles);
  lVar13 = (long)(config->super_BaseConfig).antiAliasing;
  sVar12 = (config->super_BaseConfig).imageY * lVar13;
  sVar14 = (config->super_BaseConfig).imageZ * lVar13;
  (this->bitmap).rows = sVar12;
  (this->bitmap).cols = sVar14;
  std::vector<RGB,_std::allocator<RGB>_>::vector(&(this->bitmap).data_,sVar14 * sVar12,&local_29);
  return;
}

Assistant:

RayTracerBase(RayTracerConfig const& config)
    : config(config)
    , bitmap(config.imageY * config.antiAliasing, config.imageZ * config.antiAliasing)
  {
  }